

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O3

bool __thiscall
bssl::FindEmailAddressesInName
          (bssl *this,Input name_rdn_sequence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *contained_email_addresses)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pXVar2;
  bool bVar3;
  bool bVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  pointer this_01;
  Input input;
  Input rhs;
  RelativeDistinguishedName type_and_values;
  string email_address;
  Parser rdn_parser;
  Parser rdn_sequence_parser;
  RelativeDistinguishedName local_98;
  string local_80;
  Parser local_60;
  Parser local_48;
  
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            name_rdn_sequence.data_.size_;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,*(pointer *)this_00);
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_48,input);
  paVar1 = &local_80.field_2;
  do {
    bVar3 = der::Parser::HasMore(&local_48);
    if (!bVar3) break;
    der::Parser::Parser(&local_60);
    bVar4 = der::Parser::ReadConstructed(&local_48,0x20000011,&local_60);
    if (!bVar4) {
      return false;
    }
    local_98.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (X509NameAttribute *)0x0;
    local_98.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (X509NameAttribute *)0x0;
    local_98.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ReadRdn(&local_60,&local_98);
    pXVar2 = local_98.
             super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar4) {
      if (local_98.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start == (X509NameAttribute *)0x0) {
        return false;
      }
      operator_delete(local_98.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return false;
    }
    this_01 = local_98.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_98.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_98.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = true;
    }
    else {
      do {
        rhs.data_.size_ = 9;
        rhs.data_.data_ = kTypeEmailAddressOid;
        bVar4 = der::operator==((Input)(this_01->type).data_,rhs);
        if (bVar4) {
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          local_80._M_dataplus._M_p = (pointer)paVar1;
          bVar4 = X509NameAttribute::ValueAsString(this_01,&local_80);
          if (!bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,
                              CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                       local_80.field_2._M_local_buf[0]) + 1);
            }
            bVar4 = false;
            goto LAB_004b9222;
          }
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this_00,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
        }
        this_01 = this_01 + 1;
      } while (this_01 != pXVar2);
      bVar4 = true;
    }
LAB_004b9222:
    if (local_98.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
      operator_delete(local_98.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  } while (bVar4);
  return !bVar3;
}

Assistant:

bool FindEmailAddressesInName(
    der::Input name_rdn_sequence,
    std::vector<std::string> *contained_email_addresses) {
  contained_email_addresses->clear();

  der::Parser rdn_sequence_parser(name_rdn_sequence);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }

    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      if (type_and_value.type == der::Input(kTypeEmailAddressOid)) {
        std::string email_address;
        if (!type_and_value.ValueAsString(&email_address)) {
          return false;
        }
        contained_email_addresses->push_back(std::move(email_address));
      }
    }
  }

  return true;
}